

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::scoutsubface(tetgenmesh *this,face *searchsh,triface *searchtet,int shflag)

{
  tetrahedron *pppdVar1;
  uint uVar2;
  tetrahedron endpt;
  int i;
  int iVar3;
  interresult iVar4;
  uint uVar5;
  tetrahedron *pppdVar6;
  tetrahedron ppdVar7;
  long lVar8;
  shellface *pppdVar9;
  ulong uVar10;
  int *piVar11;
  tetrahedron *pppdVar12;
  
  ppdVar7 = searchsh->sh[sorgpivot[searchsh->shver]];
  endpt = searchsh->sh[sdestpivot[searchsh->shver]];
  pppdVar6 = (tetrahedron *)((ulong)ppdVar7[this->point2simindex] & 0xfffffffffffffff0);
  searchtet->tet = pppdVar6;
  if (pppdVar6[4] == ppdVar7) {
    iVar3 = 0xb;
  }
  else if (pppdVar6[5] == ppdVar7) {
    iVar3 = 3;
  }
  else {
    iVar3 = 7;
    if (pppdVar6[6] != ppdVar7) {
      iVar3 = 0;
    }
  }
  searchtet->ver = iVar3;
  iVar4 = finddirection(this,searchtet,(point)endpt);
  if (iVar4 == ACROSSVERT) {
    pppdVar6 = searchtet->tet;
    if (pppdVar6[destpivot[searchtet->ver]] != endpt) {
      if (shflag == 0) {
LAB_0012c7e8:
        puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
        puts("  the message above, your input data set, and the exact");
        puts("  command line you used to run this program, thank you.");
        exit(2);
      }
      report_selfint_edge(this,(point)ppdVar7,(point)endpt,searchsh,searchtet,ACROSSVERT);
      pppdVar6 = searchtet->tet;
    }
    piVar11 = &searchtet->ver;
    pppdVar9 = searchsh->sh;
    uVar5 = searchsh->shver;
    lVar8 = (long)(int)uVar5;
    pppdVar12 = pppdVar6;
    do {
      uVar2 = *piVar11;
      if (pppdVar12[apexpivot[(int)uVar2]] == pppdVar9[sapexpivot[lVar8]]) {
        ppdVar7 = pppdVar12[9];
        if (ppdVar7 == (tetrahedron)0x0) {
          ppdVar7 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar12[9] = ppdVar7;
          lVar8 = 0;
          do {
            pppdVar12[9][lVar8] = (double *)0x0;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          ppdVar7 = pppdVar12[9];
          pppdVar9 = searchsh->sh;
          uVar5 = searchsh->shver;
          lVar8 = (long)(int)uVar5;
        }
        else if (ppdVar7[uVar2 & 3] != (double *)0x0) goto LAB_0012c7e8;
        uVar10 = (ulong)((uVar2 & 3) << 3);
        *(ulong *)((long)ppdVar7 + uVar10) = (long)tsbondtbl[(int)uVar2][lVar8] | (ulong)pppdVar9;
        searchsh->sh[(ulong)(uVar5 & 1) + 9] =
             (shellface)((long)stbondtbl[(int)uVar2][lVar8] | (ulong)pppdVar12);
        uVar10 = *(ulong *)((long)pppdVar12 + uVar10);
        pppdVar6 = (tetrahedron *)(uVar10 & 0xfffffffffffffff0);
        uVar2 = fsymtbl[(int)uVar2][(uint)uVar10 & 0xf];
        uVar5 = uVar5 ^ 1;
        searchsh->shver = uVar5;
        ppdVar7 = pppdVar6[9];
        if (ppdVar7 == (tetrahedron)0x0) {
          ppdVar7 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar6[9] = ppdVar7;
          lVar8 = 0;
          do {
            pppdVar6[9][lVar8] = (double *)0x0;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          ppdVar7 = pppdVar6[9];
          uVar5 = searchsh->shver;
        }
        ppdVar7[uVar2 & 3] =
             (double *)((long)tsbondtbl[(int)uVar2][(int)uVar5] | (ulong)searchsh->sh);
        searchsh->sh[(ulong)(uVar5 & 1) + 9] =
             (shellface)((long)stbondtbl[(int)uVar2][(int)uVar5] | (ulong)pppdVar6);
        searchtet->tet = pppdVar6;
        searchtet->ver = uVar2;
        return 1;
      }
      pppdVar1 = pppdVar12 + facepivot1[(int)uVar2];
      pppdVar12 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      piVar11 = facepivot2[(int)uVar2] + ((uint)*pppdVar1 & 0xf);
    } while (pppdVar6 != pppdVar12);
  }
  return 0;
}

Assistant:

int tetgenmesh::scoutsubface(face* searchsh, triface* searchtet, int shflag)
{
  point pa = sorg(*searchsh);
  point pb = sdest(*searchsh);

  // Get a tet whose origin is a.
  point2tetorg(pa, *searchtet);
  // Search the edge [a,b].
  enum interresult dir = finddirection(searchtet, pb);
  if (dir == ACROSSVERT) {
    // Check validity of a PLC.
    if (dest(*searchtet) != pb) {
	  if (shflag) {
        // A vertex lies on the search edge. 
	    report_selfint_edge(pa, pb, searchsh, searchtet, dir);
	  } else {
	    terminatetetgen(this, 2);
	  }
    }
	int t1ver;
    // The edge exists. Check if the face exists.
    point pc = sapex(*searchsh);
    // Searchtet holds edge [a,b]. Search a face with apex c.
    triface spintet = *searchtet;
    while (1) {
      if (apex(spintet) == pc) {
        // Found a face matching to 'searchsh'!
        if (!issubface(spintet)) {
          // Insert 'searchsh'.
          tsbond(spintet, *searchsh);
          fsymself(spintet);
          sesymself(*searchsh);
          tsbond(spintet, *searchsh);
          *searchtet = spintet;
          return 1; 
        } else {
          terminatetetgen(this, 2);
        }
      }
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    }
  }

  return 0;
}